

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unity.c
# Opt level: O3

void UnityPrintLen(char *string,_UU32 length)

{
  char *pch;
  byte bVar1;
  uint uVar2;
  long lVar3;
  
  if ((string != (char *)0x0) && (bVar1 = *string, length != 0 && bVar1 != 0)) {
    lVar3 = 1;
    do {
      if ((byte)(bVar1 - 0x20) < 0x5f) {
        uVar2 = (uint)bVar1;
LAB_001027ba:
        putchar(uVar2);
      }
      else {
        putchar(0x5c);
        if (bVar1 == 10) {
          uVar2 = 0x6e;
          goto LAB_001027ba;
        }
        if (bVar1 == 0xd) {
          uVar2 = 0x72;
          goto LAB_001027ba;
        }
        UnityPrintNumberHex((long)string[lVar3 + -1],'\x02');
      }
      bVar1 = string[lVar3];
    } while ((bVar1 != 0) && (uVar2 = (uint)lVar3, lVar3 = lVar3 + 1, uVar2 < length));
  }
  return;
}

Assistant:

void UnityPrintLen(const char* string, const _UU32 length)
{
    const char* pch = string;

    if (pch != NULL)
    {
        while (*pch && (_UU32)(pch - string) < length)
        {
            /* printable characters plus CR & LF are printed */
            if ((*pch <= 126) && (*pch >= 32))
            {
                UNITY_OUTPUT_CHAR(*pch);
            }
            /* write escaped carriage returns */
            else if (*pch == 13)
            {
                UNITY_OUTPUT_CHAR('\\');
                UNITY_OUTPUT_CHAR('r');
            }
            /* write escaped line feeds */
            else if (*pch == 10)
            {
                UNITY_OUTPUT_CHAR('\\');
                UNITY_OUTPUT_CHAR('n');
            }
            /* unprintable characters are shown as codes */
            else
            {
                UNITY_OUTPUT_CHAR('\\');
                UnityPrintNumberHex((_U_UINT)*pch, 2);
            }
            pch++;
        }
    }
}